

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAbbrev.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFAbbreviationDeclarationSet::extract
          (DWARFAbbreviationDeclarationSet *this,DataExtractor Data,uint64_t *OffsetPtr)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t local_c4;
  undefined1 local_c0 [4];
  uint32_t PrevAbbrCode;
  DWARFAbbreviationDeclaration AbbrDecl;
  uint64_t BeginOffset;
  uint64_t *OffsetPtr_local;
  DWARFAbbreviationDeclarationSet *this_local;
  
  clear(this);
  AbbrDecl.FixedAttributeSize.Storage =
       (OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>)*OffsetPtr;
  this->Offset = (uint64_t)AbbrDecl.FixedAttributeSize.Storage;
  DWARFAbbreviationDeclaration::DWARFAbbreviationDeclaration
            ((DWARFAbbreviationDeclaration *)local_c0);
  local_c4 = 0;
  while (bVar1 = DWARFAbbreviationDeclaration::extract
                           ((DWARFAbbreviationDeclaration *)local_c0,Data,OffsetPtr), bVar1) {
    if (this->FirstAbbrCode == 0) {
      uVar2 = DWARFAbbreviationDeclaration::getCode((DWARFAbbreviationDeclaration *)local_c0);
      this->FirstAbbrCode = uVar2;
    }
    else {
      uVar2 = DWARFAbbreviationDeclaration::getCode((DWARFAbbreviationDeclaration *)local_c0);
      if (local_c4 + 1 != uVar2) {
        this->FirstAbbrCode = 0xffffffff;
      }
    }
    local_c4 = DWARFAbbreviationDeclaration::getCode((DWARFAbbreviationDeclaration *)local_c0);
    std::
    vector<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>
    ::push_back(&this->Decls,(value_type *)local_c0);
  }
  bVar1 = AbbrDecl.FixedAttributeSize.Storage !=
          (OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>)*OffsetPtr;
  DWARFAbbreviationDeclaration::~DWARFAbbreviationDeclaration
            ((DWARFAbbreviationDeclaration *)local_c0);
  return bVar1;
}

Assistant:

bool DWARFAbbreviationDeclarationSet::extract(DataExtractor Data,
                                              uint64_t *OffsetPtr) {
  clear();
  const uint64_t BeginOffset = *OffsetPtr;
  Offset = BeginOffset;
  DWARFAbbreviationDeclaration AbbrDecl;
  uint32_t PrevAbbrCode = 0;
  while (AbbrDecl.extract(Data, OffsetPtr)) {
    if (FirstAbbrCode == 0) {
      FirstAbbrCode = AbbrDecl.getCode();
    } else {
      if (PrevAbbrCode + 1 != AbbrDecl.getCode()) {
        // Codes are not consecutive, can't do O(1) lookups.
        FirstAbbrCode = UINT32_MAX;
      }
    }
    PrevAbbrCode = AbbrDecl.getCode();
    Decls.push_back(std::move(AbbrDecl));
  }
  return BeginOffset != *OffsetPtr;
}